

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Material::Material(Material *this)

{
  initializer_list<double> __l;
  allocator local_4d [20];
  allocator<double> local_39;
  double local_38 [3];
  iterator local_20;
  size_type local_18;
  Material *local_10;
  Material *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_20 = local_38;
  local_18 = 3;
  std::allocator<double>::allocator(&local_39);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<double,_std::allocator<double>_>::vector(&this->emissiveFactor,__l,&local_39);
  std::allocator<double>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->alphaMode,"OPAQUE",local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  this->alphaCutoff = 0.5;
  this->doubleSided = false;
  std::vector<int,_std::allocator<int>_>::vector(&this->lods);
  PbrMetallicRoughness::PbrMetallicRoughness(&this->pbrMetallicRoughness);
  NormalTextureInfo::NormalTextureInfo(&this->normalTexture);
  OcclusionTextureInfo::OcclusionTextureInfo(&this->occlusionTexture);
  TextureInfo::TextureInfo(&this->emissiveTexture);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::map(&this->values);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::map(&this->additionalValues);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions);
  Value::Value(&this->extras);
  std::__cxx11::string::string((string *)&this->extras_json_string);
  std::__cxx11::string::string((string *)&this->extensions_json_string);
  return;
}

Assistant:

Material() = default;